

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * __thiscall
phosg::StringReader::preadx_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  uint8_t *puVar1;
  out_of_range *this_00;
  
  if (size + offset <= this->length) {
    puVar1 = this->data;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,puVar1 + offset,puVar1 + offset + size);
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"not enough data to read");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

string StringReader::preadx(size_t offset, size_t size) const {
  if (offset + size > this->length) {
    throw out_of_range("not enough data to read");
  }
  return string(reinterpret_cast<const char*>(this->data + offset), size);
}